

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

QString * __thiscall QDirPrivate::resolveAbsoluteEntry(QDirPrivate *this)

{
  undefined1 uVar1;
  bool bVar2;
  pointer pQVar3;
  long in_RSI;
  QFileSystemEntry *pQVar4;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  QString absoluteName;
  QFileSystemEntry absoluteFileSystemEntry;
  QMutexLocker<QMutex> locker;
  QFileSystemEntry *in_stack_fffffffffffffeb8;
  QFileSystemEntry *in_stack_fffffffffffffec0;
  QFileSystemEntry *in_stack_fffffffffffffec8;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  QFileSystemEntry *entry;
  undefined1 local_e8 [24];
  undefined1 local_d0 [48];
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 local_88 [112];
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = in_RDI;
  entry = in_RDI;
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)in_stack_fffffffffffffec0,(QMutex *)in_stack_fffffffffffffeb8);
  uVar1 = QFileSystemEntry::isEmpty(in_stack_fffffffffffffec0);
  if (!(bool)uVar1) {
    QFileSystemEntry::filePath(in_stack_fffffffffffffec8);
    goto LAB_00286867;
  }
  bVar2 = QFileSystemEntry::isEmpty(in_stack_fffffffffffffec0);
  if (bVar2) {
    QFileSystemEntry::filePath(in_stack_fffffffffffffec8);
    goto LAB_00286867;
  }
  local_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x2865f4);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                     0x286602);
  if (bVar2) {
    pQVar3 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
             operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         *)0x28672a);
    (*pQVar3->_vptr_QAbstractFileEngine[0x19])(local_d0,pQVar3,3);
    QString::operator=(&in_stack_fffffffffffffec0->m_filePath,&in_stack_fffffffffffffeb8->m_filePath
                      );
    QString::~QString((QString *)0x286761);
LAB_00286761:
    local_88._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QDir::cleanPath(&pQVar4->m_filePath);
    QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_88,local_e8);
    QString::~QString((QString *)0x2867c4);
    in_stack_fffffffffffffec0 = (QFileSystemEntry *)local_88;
    QFileSystemEntry::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    QFileSystemEntry::filePath(in_stack_fffffffffffffec8);
    QFileSystemEntry::~QFileSystemEntry(in_stack_fffffffffffffec0);
  }
  else {
    bVar2 = QFileSystemEntry::isRelative((QFileSystemEntry *)0x286618);
    if ((bVar2) ||
       (bVar2 = QFileSystemEntry::isClean
                          ((QFileSystemEntry *)
                           CONCAT17(in_stack_fffffffffffffef7,
                                    CONCAT16(uVar1,in_stack_fffffffffffffef0))), !bVar2)) {
      QFileSystemEngine::absoluteName(entry);
      QFileSystemEntry::filePath(in_stack_fffffffffffffec8);
      QString::operator=(&in_stack_fffffffffffffec0->m_filePath,
                         &in_stack_fffffffffffffeb8->m_filePath);
      QString::~QString((QString *)0x2866e9);
      QFileSystemEntry::~QFileSystemEntry(in_stack_fffffffffffffec0);
      goto LAB_00286761;
    }
    pQVar4 = (QFileSystemEntry *)(in_RSI + 0x30);
    QFileSystemEntry::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    QFileSystemEntry::filePath(pQVar4);
  }
  QString::~QString((QString *)0x286856);
LAB_00286867:
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_fffffffffffffec0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return &in_RDI->m_filePath;
}

Assistant:

inline QString QDirPrivate::resolveAbsoluteEntry() const
{
    QMutexLocker locker(&fileCache.mutex);
    if (!fileCache.absoluteDirEntry.isEmpty())
        return fileCache.absoluteDirEntry.filePath();

    if (dirEntry.isEmpty())
        return dirEntry.filePath();

    QString absoluteName;
    if (!fileEngine) {
        if (!dirEntry.isRelative() && dirEntry.isClean()) {
            fileCache.absoluteDirEntry = dirEntry;
            return dirEntry.filePath();
        }

        absoluteName = QFileSystemEngine::absoluteName(dirEntry).filePath();
    } else {
        absoluteName = fileEngine->fileName(QAbstractFileEngine::AbsoluteName);
    }
    auto absoluteFileSystemEntry =
            QFileSystemEntry(QDir::cleanPath(absoluteName), QFileSystemEntry::FromInternalPath());
    fileCache.absoluteDirEntry = absoluteFileSystemEntry;
    return absoluteFileSystemEntry.filePath();
}